

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

char * common_chat_templates_source(common_chat_templates *tmpls,char *variant)

{
  bool bVar1;
  int iVar2;
  pointer pcVar3;
  char *pcVar4;
  common_log *log;
  char *in_RSI;
  
  if (in_RSI != (char *)0x0) {
    iVar2 = strcmp(in_RSI,"tool_use");
    if (iVar2 == 0) {
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>
                          *)0x33449b);
      if (!bVar1) {
        return (char *)0x0;
      }
      pcVar3 = std::unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>::
               operator->((unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>
                           *)0x3344af);
      minja::chat_template::source_abi_cxx11_(pcVar3);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      return pcVar4;
    }
    if (0 < common_log_verbosity_thold) {
      log = common_log_main();
      common_log_add(log,GGML_LOG_LEVEL_DEBUG,"%s: unknown template variant: %s\n",
                     "common_chat_templates_source",in_RSI);
    }
  }
  pcVar3 = std::unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>::
           operator->((unique_ptr<minja::chat_template,_std::default_delete<minja::chat_template>_>
                       *)0x33451d);
  minja::chat_template::source_abi_cxx11_(pcVar3);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  return pcVar4;
}

Assistant:

const char * common_chat_templates_source(const struct common_chat_templates * tmpls, const char * variant) {
    if (variant != nullptr) {
        if (strcmp(variant, "tool_use") == 0) {
            if (tmpls->template_tool_use) {
                return tmpls->template_tool_use->source().c_str();
            }
            return nullptr;
        } else {
            LOG_DBG("%s: unknown template variant: %s\n", __func__, variant);
        }
    }
    return tmpls->template_default->source().c_str();
}